

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

Presence flatbuffers::FieldDef::MakeFieldPresence(bool optional,bool required)

{
  Presence PVar1;
  
  if (!optional || !required) {
    PVar1 = kRequired;
    if (!required) {
      PVar1 = kDefault - optional;
    }
    return PVar1;
  }
  __assert_fail("!(required && optional)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                ,0x178,"static Presence flatbuffers::FieldDef::MakeFieldPresence(bool, bool)");
}

Assistant:

Presence static MakeFieldPresence(bool optional, bool required) {
    FLATBUFFERS_ASSERT(!(required && optional));
    // clang-format off
    return required ? FieldDef::kRequired
         : optional ? FieldDef::kOptional
                    : FieldDef::kDefault;
    // clang-format on
  }